

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::locate_soi_marker(jpeg_decoder *this)

{
  uint uVar1;
  bool bVar2;
  int local_1c;
  uint local_18;
  uint bytesleft;
  uint thischar;
  uint lastchar;
  jpeg_decoder *this_local;
  
  uVar1 = get_bits(this,8);
  local_18 = get_bits(this,8);
  if ((uVar1 != 0xff) || (local_18 != 0xd8)) {
    local_1c = 0x1000;
    while( true ) {
      do {
        local_1c = local_1c + -1;
        if (local_1c == 0) {
          stop_decoding(this,JPGD_NOT_JPEG);
        }
        uVar1 = get_bits(this,8);
        bVar2 = local_18 != 0xff;
        local_18 = uVar1;
      } while (bVar2);
      if (uVar1 == 0xd8) break;
      if (uVar1 == 0xd9) {
        stop_decoding(this,JPGD_NOT_JPEG);
      }
    }
    if (this->m_bit_buf >> 0x18 != 0xff) {
      stop_decoding(this,JPGD_NOT_JPEG);
    }
  }
  return;
}

Assistant:

void jpeg_decoder::locate_soi_marker()
	{
		uint lastchar, thischar;
		uint bytesleft;

		lastchar = get_bits(8);

		thischar = get_bits(8);

		/* ok if it's a normal JPEG file without a special header */

		if ((lastchar == 0xFF) && (thischar == M_SOI))
			return;

		bytesleft = 4096;

		for (; ; )
		{
			if (--bytesleft == 0)
				stop_decoding(JPGD_NOT_JPEG);

			lastchar = thischar;

			thischar = get_bits(8);

			if (lastchar == 0xFF)
			{
				if (thischar == M_SOI)
					break;
				else if (thischar == M_EOI) // get_bits will keep returning M_EOI if we read past the end
					stop_decoding(JPGD_NOT_JPEG);
			}
		}

		// Check the next character after marker: if it's not 0xFF, it can't be the start of the next marker, so the file is bad.
		thischar = (m_bit_buf >> 24) & 0xFF;

		if (thischar != 0xFF)
			stop_decoding(JPGD_NOT_JPEG);
	}